

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

quint32 __thiscall QBitArray::toUInt32(QBitArray *this,Endian endianness,bool *ok)

{
  char cVar1;
  char *pcVar2;
  quint32 qVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  
  pcVar2 = (this->d).d.ptr;
  lVar4 = (this->d).d.size * 8;
  pcVar6 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = "";
  }
  cVar1 = *pcVar6;
  lVar7 = lVar4 - cVar1;
  if (lVar7 < 0x21) {
    if (ok != (bool *)0x0) {
      *ok = true;
    }
    if (lVar7 < 1) {
      return 0;
    }
    lVar4 = ~(long)cVar1 + lVar4;
    iVar5 = 1;
    lVar7 = 0;
    qVar3 = 0;
    do {
      lVar9 = lVar4;
      if (endianness == ByteOrder) {
        lVar9 = lVar7;
      }
      iVar8 = 0;
      if (((byte)pcVar2[(lVar9 >> 3) + 1] >> ((uint)lVar9 & 7) & 1) != 0) {
        iVar8 = iVar5;
      }
      qVar3 = qVar3 + iVar8;
      lVar7 = lVar7 + 1;
      iVar5 = iVar5 * 2;
      bVar10 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar10);
  }
  else {
    qVar3 = 0;
    if (ok != (bool *)0x0) {
      *ok = false;
      return 0;
    }
  }
  return qVar3;
}

Assistant:

const T *data() const noexcept { return ptr; }